

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_DefineAutoInitProperty
              (JSContext *ctx,JSValue this_obj,JSAtom prop,JSAutoInitIDEnum id,void *opaque,
              int flags)

{
  JSShape *pJVar1;
  int iVar2;
  JSProperty *pJVar3;
  uint uVar4;
  
  iVar2 = 0;
  if ((int)this_obj.tag == -1) {
    pJVar1 = *(JSShape **)((long)this_obj.u.ptr + 0x18);
    for (uVar4 = (&(pJVar1->header).ref_count)[~(ulong)(pJVar1->prop_hash_mask & prop)]; uVar4 != 0;
        uVar4 = *(uint *)(&pJVar1->proto + uVar4) & 0x3ffffff) {
      if (*(JSAtom *)((long)&pJVar1->proto + (ulong)uVar4 * 8 + 4) == prop) {
        abort();
      }
    }
    pJVar3 = add_property(ctx,(JSObject *)this_obj.u.ptr,prop,flags & 7U | 0x30);
    if (pJVar3 == (JSProperty *)0x0) {
      iVar2 = -1;
    }
    else {
      (ctx->header).ref_count = (ctx->header).ref_count + 1;
      (pJVar3->u).init.realm_and_id = (ulong)id | (ulong)ctx;
      (pJVar3->u).init.opaque = opaque;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int JS_DefineAutoInitProperty(JSContext *ctx, JSValueConst this_obj,
                                     JSAtom prop, JSAutoInitIDEnum id,
                                     void *opaque, int flags)
{
    JSObject *p;
    JSProperty *pr;

    if (JS_VALUE_GET_TAG(this_obj) != JS_TAG_OBJECT)
        return FALSE;

    p = JS_VALUE_GET_OBJ(this_obj);

    if (find_own_property(&pr, p, prop)) {
        /* property already exists */
        abort();
        return FALSE;
    }

    /* Specialized CreateProperty */
    pr = add_property(ctx, p, prop, (flags & JS_PROP_C_W_E) | JS_PROP_AUTOINIT);
    if (unlikely(!pr))
        return -1;
    pr->u.init.realm_and_id = (uintptr_t)JS_DupContext(ctx);
    assert((pr->u.init.realm_and_id & 3) == 0);
    assert(id <= 3);
    pr->u.init.realm_and_id |= id;
    pr->u.init.opaque = opaque;
    return TRUE;
}